

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall dg::debug::DG2Dot<dg::LLVMNode>::dump_nodes(DG2Dot<dg::LLVMNode> *this)

{
  bool bVar1;
  _Rb_tree_const_iterator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>
  _Var2;
  element_type *this_00;
  undefined1 uVar3;
  value_type *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_bool>
  pVar4;
  pair<llvm::Value_*const,_dg::LLVMNode_*> *I_1;
  iterator __end0_2;
  iterator __begin0_2;
  element_type *__range4_1;
  LLVMDependenceGraph *subgraph;
  iterator __end0_1;
  iterator __begin0_1;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *__range4;
  LLVMNode *node;
  pair<llvm::Value_*const,_dg::LLVMNode_*> *I;
  iterator __end0;
  iterator __begin0;
  DependenceGraph<dg::LLVMNode> *__range3;
  DependenceGraph<dg::LLVMNode> *in_stack_ffffffffffffff08;
  _Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *in_stack_ffffffffffffff10;
  __shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *this_01;
  set<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
  *in_stack_ffffffffffffff30;
  _Self local_c8;
  _Self local_c0 [3];
  char *in_stack_ffffffffffffff58;
  map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
  *prefix;
  undefined8 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  DG2Dot<dg::LLVMNode> *in_stack_ffffffffffffff70;
  _Self local_48;
  _Self local_40;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *local_38;
  LLVMNode *local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  value_type local_10;
  
  std::operator<<((ostream *)(in_RDI + 0x1a),"\t/* nodes */\n");
  local_10 = in_RDI[0x12];
  local_18._M_node = (_Base_ptr)DependenceGraph<dg::LLVMNode>::begin(in_stack_ffffffffffffff08);
  local_20._M_node = (_Base_ptr)DependenceGraph<dg::LLVMNode>::end(in_stack_ffffffffffffff08);
  while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
    local_28 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator*
                         ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)
                          0x1c8f18);
    local_30 = local_28->second;
    dump_node(in_stack_ffffffffffffff70,
              (LLVMNode *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),
              (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),in_stack_ffffffffffffff58);
    local_38 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getSubgraphs
                         (&local_30->
                           super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
    local_40._M_node =
         (_Base_ptr)
         std::
         set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
         ::begin((set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                  *)in_stack_ffffffffffffff08);
    local_48._M_node =
         (_Base_ptr)
         std::
         set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
         ::end((set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                *)in_stack_ffffffffffffff08);
    while (bVar1 = std::operator!=(&local_40,&local_48), bVar1) {
      std::_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*>::operator*
                ((_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*> *)0x1c8fb6);
      std::
      set<dg::DependenceGraph<dg::LLVMNode>_*,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
      ::insert((set<dg::DependenceGraph<dg::LLVMNode>_*,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
                *)in_stack_ffffffffffffff30,in_RDI);
      std::_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*>::operator++
                ((_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*> *)in_stack_ffffffffffffff10);
    }
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator++
              (in_stack_ffffffffffffff10);
  }
  this_01 = (__shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             *)&stack0xffffffffffffff70;
  DependenceGraph<dg::LLVMNode>::getGlobalNodes(in_stack_ffffffffffffff08);
  std::
  __shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::get(this_01);
  pVar4 = std::
          set<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
          ::insert(in_stack_ffffffffffffff30,(value_type *)in_RDI);
  _Var2 = pVar4.first._M_node;
  uVar3 = pVar4.second;
  std::
  shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
  ::~shared_ptr((shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
                 *)0x1c9097);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    DependenceGraph<dg::LLVMNode>::getGlobalNodes(in_stack_ffffffffffffff08);
    this_00 = std::
              __shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_01);
    std::
    shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
    ::~shared_ptr((shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
                   *)0x1c90d1);
    prefix = this_00;
    local_c0[0]._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
         ::begin(this_00);
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
         ::end(this_00);
    while (bVar1 = std::operator!=(local_c0,&local_c8), bVar1) {
      std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator*
                ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)0x1c9117);
      dump_node(in_stack_ffffffffffffff70,(LLVMNode *)CONCAT71(in_stack_ffffffffffffff69,uVar3),
                (int)((ulong)_Var2._M_node >> 0x20),(char *)prefix);
      std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator++
                ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)this_01);
    }
  }
  return;
}

Assistant:

void dump_nodes() {
        out << "\t/* nodes */\n";
        for (auto &I : *dg) {
            auto *node = I.second;

            dump_node(node);

            for (auto subgraph : node->getSubgraphs()) {
                subgraphs.insert(subgraph);
            }
        }

        if (dumpedGlobals.insert(dg->getGlobalNodes().get()).second)
            for (auto &I : *dg->getGlobalNodes())
                dump_node(I.second, 1, "GL");
    }